

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::CreateContextNoConfigCase::iterate(CreateContextNoConfigCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 err;
  Library *egl;
  EGLDisplay pvVar5;
  MessageBuilder *this_00;
  Hex<16UL> hex;
  char *pcVar6;
  TestError *this_01;
  NotSupportedError *this_02;
  ostringstream *poVar7;
  long lVar8;
  ostringstream *this_03;
  UniqueDisplay display;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  undefined4 extraout_var;
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar5 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  eglu::UniqueDisplay::UniqueDisplay(&display,egl,pvVar5);
  pvVar5 = display.m_display;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"EGL_KHR_no_config_context",(allocator<char> *)&local_1c0);
  bVar2 = eglu::hasExtension(egl,pvVar5,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  if (!bVar2) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"EGL_KHR_no_config_context is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
               ,0x81);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "pass");
  lVar8 = 0;
  do {
    this_03 = (ostringstream *)(local_1b0 + 8);
    poVar7 = (ostringstream *)(local_1b0 + 8);
    if (lVar8 == 0x78) {
      eglu::UniqueDisplay::~UniqueDisplay(&display);
      return STOP;
    }
    iVar4 = *(int *)(s_apis + lVar8 + 8);
    iVar3 = (**egl->_vptr_Library)(egl);
    if (iVar3 == 0) {
      iVar3 = (*egl->_vptr_Library[0x1f])(egl);
      if (iVar3 != 0x300c) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,"egl.getError() == EGL_BAD_PARAMETER",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                   ,0x8b);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream(this_03);
      std::operator<<((ostream *)this_03,"eglBindAPI(");
      local_1c0.m_getName = eglu::getAPIName;
      local_1c0.m_value = iVar4;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_03);
      std::operator<<((ostream *)this_03,") failed, skipping");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00df5014:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    }
    else {
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream(poVar7);
      std::operator<<((ostream *)poVar7,"Creating ");
      this_00 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(char **)(s_apis + lVar8));
      std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " context");
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar7);
      hex.value._0_4_ =
           (*egl->_vptr_Library[6])
                     (egl,display.m_display,0,0,*(undefined8 *)(s_apis + lVar8 + 0x10));
      hex.value._4_4_ = extraout_var;
      iVar4 = (*egl->_vptr_Library[0x1f])(egl);
      if (hex.value != 0 && iVar4 == 0x3000) {
        (*egl->_vptr_Library[0x13])(egl,display.m_display,hex.value);
        err = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(err,"destroyContext(*display, context)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextTests.cpp"
                         ,0x9d);
        local_1b0._0_8_ = pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),"  Pass");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00df5014;
      }
      poVar7 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream(poVar7);
      std::operator<<((ostream *)poVar7,"  Fail, context: ");
      tcu::Format::operator<<((ostream *)poVar7,hex);
      std::operator<<((ostream *)poVar7,", error: ");
      pcVar6 = eglu::getErrorName(iVar4);
      std::operator<<((ostream *)poVar7,pcVar6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar7);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Failed to create context");
    }
    lVar8 = lVar8 + 0x18;
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const eglw::Library&		egl		= m_eglTestCtx.getLibrary();
		const eglu::UniqueDisplay	display	(egl, eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay(), DE_NULL));
		tcu::TestLog&				log		= m_testCtx.getLog();

		if (!eglu::hasExtension(egl, *display, "EGL_KHR_no_config_context"))
			TCU_THROW(NotSupportedError, "EGL_KHR_no_config_context is not supported");

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "pass");

		for (int apiNdx = 0; apiNdx < (int)DE_LENGTH_OF_ARRAY(s_apis); apiNdx++)
		{
			const EGLenum	api		= s_apis[apiNdx].api;

			if (egl.bindAPI(api) == EGL_FALSE)
			{
				TCU_CHECK(egl.getError() == EGL_BAD_PARAMETER);
				log << TestLog::Message << "eglBindAPI(" << eglu::getAPIStr(api) << ") failed, skipping" << TestLog::EndMessage;
				continue;
			}

			log << TestLog::Message << "Creating " << s_apis[apiNdx].name << " context" << TestLog::EndMessage;

			const EGLContext	context = egl.createContext(*display, (EGLConfig)0, EGL_NO_CONTEXT, s_apis[apiNdx].ctxAttrs);
			const EGLenum		err		= egl.getError();

			if (context == EGL_NO_CONTEXT || err != EGL_SUCCESS)
			{
				log << TestLog::Message << "  Fail, context: " << tcu::toHex(context) << ", error: " << eglu::getErrorName(err) << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to create context");
			}
			else
			{
				// Destroy
				EGLU_CHECK_CALL(egl, destroyContext(*display, context));
				log << TestLog::Message << "  Pass" << TestLog::EndMessage;
			}
		}

		return STOP;
	}